

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::SystemVerilogCodeGen(SystemVerilogCodeGen *this,Generator *generator)

{
  SystemVerilogCodeGenOptions local_70;
  Generator *local_18;
  Generator *generator_local;
  SystemVerilogCodeGen *this_local;
  
  local_70.unique_case = true;
  local_70.yosys_src = false;
  local_18 = generator;
  generator_local = (Generator *)this;
  std::__cxx11::string::string((string *)&local_70.package_name);
  local_70.line_wrap = 0x50;
  std::__cxx11::string::string((string *)&local_70.output_dir);
  local_70.extract_debug_info = false;
  SystemVerilogCodeGen(this,generator,&local_70);
  SystemVerilogCodeGenOptions::~SystemVerilogCodeGenOptions(&local_70);
  return;
}

Assistant:

SystemVerilogCodeGen::SystemVerilogCodeGen(Generator* generator)
    : SystemVerilogCodeGen(generator, {}) {}